

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O2

void secp256k1_fe_sqr(secp256k1_fe *r,secp256k1_fe *a)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  
  secp256k1_fe_verify(a);
  if (a->magnitude < 9) {
    uVar50 = a->n[0];
    uVar52 = a->n[1];
    uVar1 = a->n[2];
    uVar2 = a->n[3];
    uVar3 = a->n[4];
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar50 * 2;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar2;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar52 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar1;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar3;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar3;
    uVar47 = SUB168(auVar6 * auVar26,0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar47 & 0xfffffffffffff;
    auVar4 = auVar5 * auVar25 + auVar4 * auVar24 + auVar7 * ZEXT816(0x1000003d10);
    uVar48 = auVar4._0_8_;
    auVar40._8_8_ = 0;
    auVar40._0_8_ = uVar48 >> 0x34 | auVar4._8_8_ << 0xc;
    uVar3 = uVar3 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar50;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar52 * 2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar1;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar1;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar47 >> 0x34 | SUB168(auVar6 * auVar26,8) << 0xc;
    auVar4 = auVar8 * auVar27 + auVar40 + auVar9 * auVar28 + auVar10 * auVar29 +
             auVar11 * ZEXT816(0x1000003d10);
    uVar47 = auVar4._0_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar47 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar50;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar50;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar52;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar3;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar1 * 2;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar2;
    auVar4 = auVar13 * auVar31 + auVar41 + auVar14 * auVar32;
    uVar49 = auVar4._0_8_;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar49 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (uVar49 & 0xfffffffffffff) << 4 | (uVar47 & 0xfffffffffffff) >> 0x30;
    auVar4 = auVar12 * auVar30 + ZEXT816(0x1000003d1) * auVar33;
    uVar49 = auVar4._0_8_;
    r->n[0] = uVar49 & 0xfffffffffffff;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar49 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar50 * 2;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar52;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar1;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar3;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar2;
    auVar5 = auVar16 * auVar35 + auVar43 + auVar17 * auVar36;
    uVar49 = auVar5._0_8_;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar49 & 0xfffffffffffff;
    auVar4 = auVar15 * auVar34 + auVar42 + auVar18 * ZEXT816(0x1000003d10);
    uVar51 = auVar4._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = uVar49 >> 0x34 | auVar5._8_8_ << 0xc;
    r->n[1] = uVar51 & 0xfffffffffffff;
    auVar44._8_8_ = 0;
    auVar44._0_8_ = uVar51 >> 0x34 | auVar4._8_8_ << 0xc;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar50 * 2;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar1;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar52;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar52;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar3;
    auVar45 = auVar21 * auVar39 + auVar45;
    uVar50 = auVar45._0_8_;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar50 & 0xfffffffffffff;
    auVar4 = auVar19 * auVar37 + auVar44 + auVar20 * auVar38 + auVar22 * ZEXT816(0x1000003d10);
    uVar52 = auVar4._0_8_;
    r->n[2] = uVar52 & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = (uVar52 >> 0x34 | auVar4._8_8_ << 0xc) + (uVar48 & 0xfffffffffffff);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar50 >> 0x34 | auVar45._8_8_ << 0xc;
    auVar46 = auVar23 * ZEXT816(0x1000003d10) + auVar46;
    uVar50 = auVar46._0_8_;
    r->n[3] = uVar50 & 0xfffffffffffff;
    r->n[4] = (uVar50 >> 0x34 | auVar46._8_8_ << 0xc) + (uVar47 & 0xffffffffffff);
    r->magnitude = 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/field_impl.h"
          ,0x156,"test condition failed: a->magnitude <= 8");
  abort();
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_sqr(secp256k1_fe *r, const secp256k1_fe *a) {
    secp256k1_fe_verify(a);
    VERIFY_CHECK(a->magnitude <= 8);
    secp256k1_fe_impl_sqr(r, a);
    r->magnitude = 1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
}